

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbdif.cpp
# Opt level: O2

char * ask_user_name(char *szPrompt,char *szDefault)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  char *__s;
  size_t sVar4;
  char *pcVar5;
  char cVar6;
  
  pcVar3 = ask_user_string(szPrompt,szDefault);
  pcVar5 = pcVar3;
  do {
    __s = pcVar5;
    cVar6 = *__s;
    iVar2 = isspace((int)cVar6);
    pcVar1 = __s;
    if ((iVar2 == 0) || (cVar6 == '\n')) break;
    pcVar5 = __s + 1;
  } while (cVar6 != '\0');
  while( true ) {
    iVar2 = isspace((int)cVar6);
    if (((iVar2 != 0) || (cVar6 == '\0')) || (cVar6 == '\n')) break;
    cVar6 = pcVar1[1];
    pcVar1 = pcVar1 + 1;
  }
  *pcVar1 = '\0';
  sVar4 = strlen(__s);
  pcVar5 = (char *)operator_new__(sVar4 + 1);
  strcpy(pcVar5,__s);
  operator_delete(pcVar3,1);
  return pcVar5;
}

Assistant:

char*
ask_user_name (const char* szPrompt, const char* szDefault)
{
  char	*szResult = ask_user_string(szPrompt, szDefault);
  char	*s1, *s2, *szNewResult;

  // strip spaces
  s1 = szResult;
  while(isspace(*s1) && '\0' != *s1 && '\n' != *s1)
    ++s1;

  s2 = s1;
  while(!isspace(*s2) && '\0' != *s2 && '\n' != *s2)
    ++s2;
  *s2 = '\0';

  szNewResult = new char[strlen(s1) + 1];
  strcpy(szNewResult, s1);

  delete szResult;

  return szNewResult;
}